

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureLookUpSession_SessionFoundHelper::
initiatorFixtureLookUpSession_SessionFoundHelper
          (initiatorFixtureLookUpSession_SessionFoundHelper *this,TestDetails *details)

{
  TestDetails *details_local;
  initiatorFixtureLookUpSession_SessionFoundHelper *this_local;
  
  initiatorFixture::initiatorFixture(&this->super_initiatorFixture);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__initiatorFixtureLookUpSession_SessionFoundHelper_00465390;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)&PTR__initiatorFixtureLookUpSession_SessionFoundHelper_004653e8;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, LookUpSession_SessionFound)
{
  startLoggedOn();
  std::string delimSOH = "\x01";
  std::string header = "8=FIX.4.2" + delimSOH
      + "9=100" + delimSOH
      + "35=A" + delimSOH
      + "49=TW" + delimSOH
      + "56=ISLD" + delimSOH;

  Session* actualSession = object->lookupSession(header, false);
  CHECK(nullptr != actualSession);
}